

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O0

int __thiscall EthUdpPort::PacketReceive(EthUdpPort *this,uchar *packet,size_t nbytes)

{
  ostream *this_00;
  int local_24;
  int nRecv;
  size_t nbytes_local;
  uchar *packet_local;
  EthUdpPort *this_local;
  
  local_24 = SocketInternals::Recv
                       (this->sockPtr,packet,nbytes,(this->super_EthBasePort).ReceiveTimeout);
  if (local_24 == 8) {
    this_00 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                              "PacketReceive: only extra data");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    EthBasePort::ProcessExtraData(&this->super_EthBasePort,packet);
    local_24 = 0;
  }
  return local_24;
}

Assistant:

int EthUdpPort::PacketReceive(unsigned char *packet, size_t nbytes)
{
    int nRecv = sockPtr->Recv(packet, nbytes, ReceiveTimeout);
    if (nRecv == static_cast<int>(FW_EXTRA_SIZE)) {
        outStr << "PacketReceive: only extra data" << std::endl;
        ProcessExtraData(packet);
        nRecv = 0;
    }
    return nRecv;
}